

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hebrwcal.cpp
# Opt level: O0

int32_t __thiscall icu_63::HebrewCalendar::yearType(HebrewCalendar *this,int32_t year)

{
  int32_t local_1c;
  int local_18;
  int type;
  int32_t yearLength;
  int32_t year_local;
  HebrewCalendar *this_local;
  
  local_18 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x23])(this,(ulong)(uint)year);
  if (0x17c < local_18) {
    local_18 = local_18 + -0x1e;
  }
  if (local_18 == 0x161) {
    local_1c = 0;
  }
  else if (local_18 == 0x162) {
    local_1c = 1;
  }
  else if (local_18 == 0x163) {
    local_1c = 2;
  }
  else {
    local_1c = 1;
  }
  return local_1c;
}

Assistant:

int32_t HebrewCalendar::yearType(int32_t year) const
{
    int32_t yearLength = handleGetYearLength(year);

    if (yearLength > 380) {
        yearLength -= 30;        // Subtract length of leap month.
    }

    int type = 0;

    switch (yearLength) {
  case 353:
      type = 0; break;
  case 354:
      type = 1; break;
  case 355:
      type = 2; break;
  default:
      //throw new RuntimeException("Illegal year length " + yearLength + " in year " + year);
      type = 1;
    }
    return type;
}